

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

ArrayBuilder<kj::Promise<unsigned_long>_> * __thiscall
kj::ArrayBuilder<kj::Promise<unsigned_long>_>::operator=
          (ArrayBuilder<kj::Promise<unsigned_long>_> *this,
          ArrayBuilder<kj::Promise<unsigned_long>_> *other)

{
  RemoveConst<kj::Promise<unsigned_long>_> *pRVar1;
  ArrayDisposer *pAVar2;
  
  dispose(this);
  pRVar1 = other->pos;
  this->ptr = other->ptr;
  this->pos = pRVar1;
  pAVar2 = other->disposer;
  this->endPtr = other->endPtr;
  this->disposer = pAVar2;
  other->ptr = (Promise<unsigned_long> *)0x0;
  other->pos = (RemoveConst<kj::Promise<unsigned_long>_> *)0x0;
  other->endPtr = (Promise<unsigned_long> *)0x0;
  return this;
}

Assistant:

ArrayBuilder& operator=(ArrayBuilder&& other) {
    dispose();
    ptr = other.ptr;
    pos = other.pos;
    endPtr = other.endPtr;
    disposer = other.disposer;
    other.ptr = nullptr;
    other.pos = nullptr;
    other.endPtr = nullptr;
    return *this;
  }